

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O2

void __thiscall CVmObjString::cons_shrink_buffer(CVmObjString *this,char *ptr)

{
  int iVar1;
  undefined4 extraout_var;
  uint16_t tmp;
  long lVar3;
  ushort *puVar2;
  
  puVar2 = (ushort *)(this->super_CVmObject).ext_;
  lVar3 = ((long)ptr - (long)puVar2) + -2;
  if (0xff < (ulong)*puVar2 - lVar3) {
    iVar1 = (*G_mem_X->varheap_->_vptr_CVmVarHeap[5])
                      (G_mem_X->varheap_,(long)ptr - (long)puVar2,puVar2,this);
    puVar2 = (ushort *)CONCAT44(extraout_var,iVar1);
    (this->super_CVmObject).ext_ = (char *)puVar2;
  }
  *puVar2 = (ushort)lVar3;
  return;
}

Assistant:

void CVmObjString::cons_shrink_buffer(VMG_ char *ptr)
{
    /* figure the offset of the pointer into the current buffer */
    size_t siz = (size_t)(ptr - (ext_ + VMB_LEN));

    /* 
     *   If the savings are substantial enough, reallocate.  If the size is
     *   unchanged, or it's within a reasonable margin of the target size, do
     *   nothing.  Reallocation isn't free (we have to find memory and make a
     *   copy of the current buffer), so it's more efficient to waste a
     *   little memory if the savings are substantial.  
     */
    if (vmb_get_len(ext_) - siz >= 256)
    {
        /* reallocate at the new size */
        ext_ = (char *)G_mem->get_var_heap()->realloc_mem(
            siz + VMB_LEN, ext_, this);
    }

    /* write the final length */
    vmb_put_len(ext_, siz);
}